

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void tinyxml2::XMLNode::DeleteNode(XMLNode *node)

{
  MemPool *pMVar1;
  XMLDocument *pXVar2;
  XMLNode **ppXVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  
  if (node == (XMLNode *)0x0) {
    return;
  }
  iVar4 = (*node->_vptr_XMLNode[3])();
  if (CONCAT44(extraout_var,iVar4) == 0) {
    pXVar2 = node->_document;
    iVar4 = (pXVar2->_unlinked)._size;
    lVar5 = (long)iVar4;
    if (0 < lVar5) {
      ppXVar3 = (pXVar2->_unlinked)._mem;
      lVar6 = 0;
      do {
        if (ppXVar3[lVar6] == node) {
          ppXVar3[lVar6] = ppXVar3[lVar5 + -1];
          (pXVar2->_unlinked)._size = iVar4 + -1;
          break;
        }
        lVar6 = lVar6 + 1;
      } while (lVar5 != lVar6);
    }
  }
  pMVar1 = node->_memPool;
  (*node->_vptr_XMLNode[0xf])(node);
  (*pMVar1->_vptr_MemPool[4])(pMVar1,node);
  return;
}

Assistant:

void XMLNode::DeleteNode( XMLNode* node )
{
    if ( node == 0 ) {
        return;
    }
	TIXMLASSERT(node->_document);
	if (!node->ToDocument()) {
		node->_document->MarkInUse(node);
	}

    MemPool* pool = node->_memPool;
    node->~XMLNode();
    pool->Free( node );
}